

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

int Gia_Rsb2ManDivs(Gia_Rsb2Man_t *p,int iNode)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  word wVar5;
  word *pwVar6;
  int *pRefs;
  int local_18;
  int iNodeLevel;
  int i;
  int iNode_local;
  Gia_Rsb2Man_t *p_local;
  
  pRefs._4_4_ = 0;
  piVar4 = Vec_IntArray(&p->vRefs);
  wVar5 = Gia_Rsb2ManOdcs(p,iNode);
  p->CareSet = wVar5;
  uVar1 = p->CareSet;
  wVar5 = Vec_WrdEntry(&p->vSims,iNode << 1);
  p->Truth1 = uVar1 & wVar5;
  p->Truth0 = p->CareSet & (p->Truth1 ^ 0xffffffffffffffff);
  Vec_PtrClear(&p->vpDivs);
  Vec_PtrPush(&p->vpDivs,&p->Truth0);
  Vec_PtrPush(&p->vpDivs,&p->Truth1);
  Vec_IntClear(&p->vDivs);
  Vec_IntPushTwo(&p->vDivs,-1,-1);
  for (local_18 = 1; local_18 <= p->nPis; local_18 = local_18 + 1) {
    pwVar6 = Vec_WrdEntryP(&p->vSims,local_18 << 1);
    Vec_PtrPush(&p->vpDivs,pwVar6);
    Vec_IntPush(&p->vDivs,local_18);
  }
  iVar2 = Gia_Rsb2ManMffc(p,iNode);
  p->nMffc = iVar2;
  if (-1 < p->nLevelIncrease) {
    iVar2 = Gia_Rsb2ManLevel(p);
    p->Level = iVar2;
    pRefs._4_4_ = Vec_IntEntry(&p->vLevels,iNode);
  }
  local_18 = p->nPis;
  while (local_18 = local_18 + 1, local_18 < p->iFirstPo) {
    if ((piVar4[local_18] != 0) &&
       ((p->nLevelIncrease < 0 ||
        (iVar2 = Vec_IntEntry(&p->vLevels,local_18), iVar2 <= pRefs._4_4_ + p->nLevelIncrease)))) {
      pwVar6 = Vec_WrdEntryP(&p->vSims,local_18 * 2);
      Vec_PtrPush(&p->vpDivs,pwVar6);
      Vec_IntPush(&p->vDivs,local_18);
    }
  }
  iVar2 = Vec_IntSize(&p->vDivs);
  iVar3 = Vec_PtrSize(&p->vpDivs);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntSize(&p->vDivs) == Vec_PtrSize(&p->vpDivs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x11e,"int Gia_Rsb2ManDivs(Gia_Rsb2Man_t *, int)");
  }
  iVar2 = Vec_IntSize(&p->vDivs);
  return iVar2;
}

Assistant:

int Gia_Rsb2ManDivs( Gia_Rsb2Man_t * p, int iNode )
{
    int i, iNodeLevel = 0;
    int * pRefs = Vec_IntArray( &p->vRefs );
    p->CareSet = Gia_Rsb2ManOdcs( p, iNode );
    p->Truth1 = p->CareSet & Vec_WrdEntry(&p->vSims, 2*iNode);
    p->Truth0 = p->CareSet & ~p->Truth1;
    Vec_PtrClear( &p->vpDivs );
    Vec_PtrPush( &p->vpDivs, &p->Truth0 );
    Vec_PtrPush( &p->vpDivs, &p->Truth1 );
    Vec_IntClear( &p->vDivs );
    Vec_IntPushTwo( &p->vDivs, -1, -1 );
    for ( i = 1; i <= p->nPis; i++ )
    {
        Vec_PtrPush( &p->vpDivs, Vec_WrdEntryP(&p->vSims, 2*i) );
        Vec_IntPush( &p->vDivs, i );
    }
    p->nMffc = Gia_Rsb2ManMffc( p, iNode );
    if ( p->nLevelIncrease >= 0 )
    {
        p->Level = Gia_Rsb2ManLevel(p);
        iNodeLevel = Vec_IntEntry(&p->vLevels, iNode);
    }
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
    {
        if ( !pRefs[i] || (p->nLevelIncrease >= 0 && Vec_IntEntry(&p->vLevels, i) > iNodeLevel + p->nLevelIncrease) )
            continue;
        Vec_PtrPush( &p->vpDivs, Vec_WrdEntryP(&p->vSims, 2*i) );
        Vec_IntPush( &p->vDivs, i );
    }
    assert( Vec_IntSize(&p->vDivs) == Vec_PtrSize(&p->vpDivs) );
    return Vec_IntSize(&p->vDivs);
}